

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::addSingleton(ISingleton *singleton)

{
  vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_> **ppvVar1;
  ISingleton *local_10;
  ISingleton *singleton_local;
  
  local_10 = singleton;
  ppvVar1 = anon_unknown_2::getSingletons();
  clara::std::vector<Catch::ISingleton_*,_std::allocator<Catch::ISingleton_*>_>::push_back
            (*ppvVar1,&local_10);
  return;
}

Assistant:

void addSingleton(ISingleton* singleton ) {
        getSingletons()->push_back( singleton );
    }